

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O0

void __thiscall VersionBitsTester::VersionBitsTester(VersionBitsTester *this,FastRandomContext *rng)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  TestConditionChecker *in_stack_ffffffffffffff78;
  undefined8 *local_70;
  undefined8 *local_58;
  undefined8 *local_40;
  undefined8 *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::vector
            ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)in_stack_ffffffffffffff78);
  local_20 = in_RDI + 4;
  do {
    TestConditionChecker::TestConditionChecker(in_stack_ffffffffffffff78);
    local_20 = local_20 + 7;
  } while (local_20 != in_RDI + 0x2e);
  local_40 = in_RDI + 0x2e;
  do {
    TestDelayedActivationConditionChecker::TestDelayedActivationConditionChecker
              ((TestDelayedActivationConditionChecker *)in_stack_ffffffffffffff78);
    local_40 = local_40 + 7;
  } while (local_40 != in_RDI + 0x58);
  local_58 = in_RDI + 0x58;
  do {
    TestAlwaysActiveConditionChecker::TestAlwaysActiveConditionChecker
              ((TestAlwaysActiveConditionChecker *)in_stack_ffffffffffffff78);
    local_58 = local_58 + 7;
  } while (local_58 != in_RDI + 0x82);
  local_70 = in_RDI + 0x82;
  do {
    TestNeverActiveConditionChecker::TestNeverActiveConditionChecker
              ((TestNeverActiveConditionChecker *)in_stack_ffffffffffffff78);
    local_70 = local_70 + 7;
  } while (local_70 != in_RDI + 0xac);
  *(undefined4 *)(in_RDI + 0xac) = 1000;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester(FastRandomContext& rng) : m_rng{rng} {}